

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

int icamax(int n,complex<float> *x,int incx)

{
  complex<float> z;
  complex<float> z_00;
  complex<float> z_01;
  complex<float> z_02;
  complex<float> z_03;
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_0000003c;
  int iVar5;
  long lVar6;
  float fVar7;
  float local_34;
  
  iVar2 = 0;
  if (0 < incx && 0 < n) {
    if (n == 1) {
      iVar2 = 1;
    }
    else {
      z._M_value._4_4_ = in_register_0000003c;
      z._M_value._0_4_ = n;
      iVar4 = n;
      local_34 = cabs1(z);
      if (incx == 1) {
        uVar3 = 1;
        uVar1 = 1;
        do {
          lVar6 = 0;
          do {
            if (uVar1 - (uint)n == lVar6) {
              return (int)uVar3;
            }
            z_02._M_value._4_4_ = in_register_0000003c;
            z_02._M_value._0_4_ = iVar4;
            fVar7 = cabs1(z_02);
            lVar6 = lVar6 + -1;
          } while (fVar7 <= local_34);
          z_03._M_value._4_4_ = in_register_0000003c;
          z_03._M_value._0_4_ = iVar4;
          local_34 = cabs1(z_03);
          uVar1 = uVar1 - lVar6;
          uVar3 = uVar1 & 0xffffffff;
        } while( true );
      }
      iVar2 = 1;
      for (iVar5 = 2; iVar5 - n != 1; iVar5 = iVar5 + 1) {
        z_00._M_value._4_4_ = in_register_0000003c;
        z_00._M_value._0_4_ = iVar4;
        fVar7 = cabs1(z_00);
        if (local_34 < fVar7) {
          z_01._M_value._4_4_ = in_register_0000003c;
          z_01._M_value._0_4_ = iVar4;
          local_34 = cabs1(z_01);
          iVar2 = iVar5;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int icamax ( int n, complex <float> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ICAMAX indexes the vector element of maximum absolute value.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, int ICAMAX, the index of the element of maximum
//    absolute value.
//
{
  int i;
  int ix;
  float smax;
  int value;

  value = 0;

  if ( n < 1 || incx  <=  0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx != 1 )
  {
    ix = 0;
    smax = cabs1 ( x[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( smax < cabs1 ( x[ix] ) )
      {
        value = i + 1;
        smax = cabs1 ( x[ix] );
      }
      ix = ix + incx;
    }
  }
  else
  {
    smax = cabs1 ( x[0] );
    for ( i = 1; i < n; i++ )
    {
      if ( smax < cabs1 ( x[i] ) )
      {
        value = i + 1;
        smax = cabs1 ( x[i] );
      }
    }
  }

  return value;
}